

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles3::Performance::anon_unknown_0::BaseCase::iterate(BaseCase *this)

{
  _Vector_impl_data *p_Var1;
  TestLog *log;
  RenderContext *context;
  TextureFormat TVar2;
  BaseCase *pBVar3;
  RenderData *shaderProgram;
  int iVar4;
  deUint32 dVar5;
  uint uVar6;
  undefined4 extraout_var;
  RenderData *pRVar7;
  pointer __dest;
  pointer *ppSVar8;
  SampleBuilder *pSVar9;
  TestError *this_00;
  PixelBufferAccess *dst;
  LogValueInfo *access;
  string *psVar10;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t __n;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  int step;
  int iVar11;
  ulong uVar12;
  size_t sVar13;
  pointer __p;
  ChannelOrder CVar14;
  pointer pSVar15;
  undefined1 *puVar16;
  int iVar17;
  size_t sVar18;
  pointer pSVar19;
  pointer this_01;
  int *piVar20;
  ulong uVar21;
  bool bVar22;
  PtrData<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  in_stack_fffffffffffff988;
  allocator<char> local_668;
  allocator<char> local_667;
  allocator<char> local_666;
  allocator<char> local_665;
  allocator<char> local_664;
  allocator<char> local_663;
  allocator<char> local_662;
  allocator<char> local_661;
  allocator<char> local_660;
  allocator<char> local_65f;
  allocator<char> local_65e;
  allocator<char> local_65d;
  allocator<char> local_65c;
  allocator<char> local_65b;
  allocator<char> local_65a;
  allocator<char> local_659;
  BaseCase *local_658;
  RenderDataP occludedData;
  RenderDataP occluderData;
  vector<int,_std::allocator<int>_> params;
  vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
  results;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  LogValueInfo local_510;
  LogValueInfo local_4a8;
  Renderbuffer depthbuffer;
  Renderbuffer renderbuffer;
  int workload;
  ChannelType CStack_40c;
  undefined1 auStack_408 [16];
  undefined4 uStack_3f8;
  int iStack_3f4;
  Framebuffer framebuffer;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  TextureLevel resultTex;
  Random rng;
  LogValueInfo local_100;
  LogValueInfo local_98;
  Functions *gl;
  
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar4);
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper(&framebuffer,gl);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper(&renderbuffer,gl);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper(&depthbuffer,gl);
  results.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  params.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  occluderData.
  super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  .m_data.ptr = (RenderData *)0x0;
  results.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  results.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  occludedData.
  super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  .m_data.ptr = (RenderData *)0x0;
  params.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  params.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  workload = RGBA;
  CStack_40c = UNORM_INT8;
  tcu::TextureLevel::TextureLevel(&resultTex,(TextureFormat *)&workload,0x200,0x200,1);
  local_658 = this;
  dVar5 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  uVar6 = tcu::CommandLine::getBaseSeed
                    (((local_658->super_TestCase).super_TestNode.m_testCtx)->m_cmdLine);
  dVar5 = ::deInt32Hash(dVar5);
  deRandom_init(&rng.m_rnd,uVar6 ^ dVar5);
  pBVar3 = local_658;
  (*(local_658->super_TestCase).super_TestNode._vptr_TestNode[6])(local_658);
  (*gl->bindRenderbuffer)(0x8d41,renderbuffer.super_ObjectWrapper.m_object);
  (*gl->renderbufferStorage)(0x8d41,0x8058,0x200,0x200);
  (*gl->bindRenderbuffer)(0x8d41,depthbuffer.super_ObjectWrapper.m_object);
  (*gl->renderbufferStorage)(0x8d41,0x88f0,0x200,0x200);
  (*gl->bindFramebuffer)(0x8d40,framebuffer.super_ObjectWrapper.m_object);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,renderbuffer.super_ObjectWrapper.m_object);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8d00,0x8d41,depthbuffer.super_ObjectWrapper.m_object);
  (*gl->viewport)(0,0,0x200,0x200);
  (*gl->clearColor)(0.125,0.25,0.5,1.0);
  iVar4 = (*(pBVar3->super_TestCase).super_TestNode._vptr_TestNode[9])(pBVar3);
  pRVar7 = (RenderData *)operator_new(0x108);
  (*(pBVar3->super_TestCase).super_TestNode._vptr_TestNode[7])(&workload,pBVar3);
  RenderData::RenderData(pRVar7,(ObjectData *)&workload,pBVar3->m_renderCtx,log);
  local_98.m_name._M_dataplus._M_p = (pointer)0x0;
  de::details::
  MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  ::operator=(&occluderData,in_stack_fffffffffffff988);
  de::details::
  UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  ::reset((UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
           *)&local_98);
  ObjectData::~ObjectData((ObjectData *)&workload);
  pRVar7 = (RenderData *)operator_new(0x108);
  (*(pBVar3->super_TestCase).super_TestNode._vptr_TestNode[8])(&workload,pBVar3);
  RenderData::RenderData(pRVar7,(ObjectData *)&workload,pBVar3->m_renderCtx,log);
  local_98.m_name._M_dataplus._M_p = (pointer)0x0;
  de::details::
  MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  ::operator=(&occludedData,in_stack_fffffffffffff988);
  de::details::
  UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  ::reset((UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
           *)&local_98);
  ObjectData::~ObjectData((ObjectData *)&workload);
  if (((occluderData.
        super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
        .m_data.ptr)->m_program).m_program.m_info.linkOk == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"occluderData->m_program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pDepthTests.cpp"
               ,0x243);
  }
  else {
    if (((occludedData.
          super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
          .m_data.ptr)->m_program).m_program.m_info.linkOk != false) {
      (*gl->clear)(0x4500);
      (*gl->enable)(0xb71);
      render(pBVar3,occluderData.
                    super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                    .m_data.ptr);
      render(pBVar3,occludedData.
                    super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                    .m_data.ptr);
      context = pBVar3->m_renderCtx;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&workload,&resultTex);
      dst = (PixelBufferAccess *)&workload;
      glu::readPixels(context,0,0,dst);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_98,&resultTex);
      shaderProgram =
           occluderData.
           super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
           .m_data.ptr;
      pRVar7 = occludedData.
               super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
               .m_data.ptr;
      TVar2 = (TextureFormat)((pBVar3->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a8,"Geometry",(allocator<char> *)&local_100);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"Geometry",(allocator<char> *)&local_5f0);
      tcu::LogSection::LogSection((LogSection *)&workload,&local_4a8.m_name,&local_510.m_name);
      CVar14 = TVar2.order;
      tcu::LogSection::write((LogSection *)&workload,CVar14,__buf,(size_t)dst);
      tcu::LogSection::~LogSection((LogSection *)&workload);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_4a8);
      _workload = TVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_408);
      std::operator<<((ostream *)auStack_408,
                      "Occluding geometry is green with shade dependent on depth (rgb == 0, depth, 0)"
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&workload,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_408);
      _workload = TVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_408);
      std::operator<<((ostream *)auStack_408,
                      "Occluded geometry is red with shade dependent on depth (rgb == depth, 0, 0)")
      ;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&workload,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_408);
      _workload = TVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_408);
      std::operator<<((ostream *)auStack_408,"Primitive edges are a lighter shade of red/green");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&workload,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_408);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a8,"Test Geometry",(allocator<char> *)&local_100);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"Test Geometry",(allocator<char> *)&local_5f0);
      access = &local_98;
      tcu::LogImage::LogImage
                ((LogImage *)&workload,&local_4a8.m_name,&local_510.m_name,
                 (ConstPixelBufferAccess *)access,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&workload,CVar14,__buf_00,(size_t)access);
      tcu::LogImage::~LogImage((LogImage *)&workload);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_4a8);
      tcu::TestLog::endSection((TestLog *)TVar2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a8,"Occluder",(allocator<char> *)&local_100);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"Occluder",(allocator<char> *)&local_5f0);
      tcu::LogSection::LogSection((LogSection *)&workload,&local_4a8.m_name,&local_510.m_name);
      tcu::LogSection::write((LogSection *)&workload,CVar14,__buf_01,(size_t)access);
      tcu::LogSection::~LogSection((LogSection *)&workload);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_4a8);
      glu::operator<<((TestLog *)TVar2,&shaderProgram->m_program);
      tcu::TestLog::endSection((TestLog *)TVar2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a8,"Occluded",(allocator<char> *)&local_100);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"Occluded",(allocator<char> *)&local_5f0);
      tcu::LogSection::LogSection((LogSection *)&workload,&local_4a8.m_name,&local_510.m_name);
      tcu::LogSection::write((LogSection *)&workload,CVar14,__buf_02,(size_t)access);
      tcu::LogSection::~LogSection((LogSection *)&workload);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_4a8);
      glu::operator<<((TestLog *)TVar2,&pRVar7->m_program);
      tcu::TestLog::endSection((TestLog *)TVar2);
      std::vector<int,_std::allocator<int>_>::reserve(&params,0xa0);
      for (iVar11 = 0; iVar11 != 10; iVar11 = iVar11 + 1) {
        workload = (iVar11 * iVar4) / 10;
        iVar17 = 0x10;
        while (bVar22 = iVar17 != 0, iVar17 = iVar17 + -1, bVar22) {
          std::vector<int,_std::allocator<int>_>::push_back(&params,&workload);
        }
      }
      de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (&rng,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      params.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 params.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      pSVar15 = (pointer)0x0;
      pSVar19 = (pointer)0x0;
      this_01 = (pointer)0x0;
      for (uVar12 = 0;
          uVar12 < (ulong)((long)params.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)params.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2); uVar12 = uVar12 + 1) {
        iVar4 = params.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[uVar12];
        (*(local_658->super_TestCase).super_TestNode._vptr_TestNode[10])
                  (&workload,local_658,
                   occluderData.
                   super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                   .m_data.ptr,
                   occludedData.
                   super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                   .m_data.ptr);
        iStack_3f4 = iVar4;
        uStack_3f8 = (int)uVar12;
        if (pSVar19 == pSVar15) {
          sVar18 = (long)pSVar15 - (long)this_01;
          if (sVar18 == 0x7fffffffffffffe0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          __p = (pointer)((long)sVar18 >> 5);
          pSVar19 = (pointer)&DAT_00000001;
          if (pSVar15 != this_01) {
            pSVar19 = __p;
          }
          puVar16 = (undefined1 *)((long)&__p->nullTime + (long)&pSVar19->nullTime);
          if ((undefined1 *)0x3fffffffffffffe < puVar16) {
            puVar16 = (undefined1 *)0x3ffffffffffffff;
          }
          if (CARRY8((ulong)pSVar19,(ulong)__p)) {
            puVar16 = (undefined1 *)0x3ffffffffffffff;
          }
          if (puVar16 == (undefined1 *)0x0) {
            __dest = (pointer)0x0;
            __n = extraout_RDX;
          }
          else {
            __dest = (pointer)operator_new((long)puVar16 << 5);
            __n = extraout_RDX_00;
          }
          __dest[(long)__p].testTime = auStack_408._8_8_;
          (&__dest[(long)__p].testTime)[1] = _uStack_3f8;
          __dest[(long)__p].nullTime = (deInt64)_workload;
          __dest[(long)__p].baseTime = auStack_408._0_8_;
          if (0 < (long)sVar18) {
            memmove(__dest,this_01,sVar18);
            __n = extraout_RDX_01;
          }
          pSVar19 = (pointer)(sVar18 + (long)__dest);
          std::
          _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
          ::_M_deallocate((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                           *)this_01,__p,__n);
          pSVar15 = __dest + (long)puVar16;
          results.
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start = __dest;
          results.
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar15;
        }
        else {
          pSVar19->testTime = auStack_408._8_8_;
          pSVar19->order = (int)uVar12;
          pSVar19->workload = iVar4;
          pSVar19->nullTime = (deInt64)_workload;
          pSVar19->baseTime = auStack_408._0_8_;
          __dest = this_01;
        }
        pSVar19 = pSVar19 + 1;
        this_01 = __dest;
        results.
        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar19;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"Samples",&local_667);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"Samples",&local_668);
      TVar2 = (TextureFormat)((local_658->super_TestCase).super_TestNode.m_testCtx)->m_log;
      uVar12 = (long)pSVar19 - (long)this_01 >> 5;
      ppSVar8 = (pointer *)&this_01->baseTime;
      sVar18 = 0;
      do {
        sVar13 = uVar12;
        if ((uVar12 == sVar18) || (sVar13 = sVar18, *ppSVar8 != (pointer)0x0)) break;
        sVar18 = sVar18 + 1;
        p_Var1 = (_Vector_impl_data *)(ppSVar8 + -1);
        ppSVar8 = ppSVar8 + 4;
      } while (p_Var1->_M_start == (pointer)0x0);
      tcu::LogSampleList::LogSampleList((LogSampleList *)&workload,&local_158,&local_178);
      CVar14 = TVar2.order;
      tcu::LogSampleList::write((LogSampleList *)&workload,CVar14,__buf_03,sVar18);
      tcu::LogSampleList::~LogSampleList((LogSampleList *)&workload);
      tcu::TestLog::startSampleInfo((TestLog *)TVar2);
      if (sVar13 < uVar12) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5f0,"Workload",(allocator<char> *)&stack0xfffffffffffff997);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_530,"Workload",&local_659);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_550,glcts::fixed_sample_locations_values + 1,&local_65a);
        psVar10 = &local_550;
        tcu::LogValueInfo::LogValueInfo
                  ((LogValueInfo *)&workload,&local_5f0,&local_530,psVar10,
                   QP_SAMPLE_VALUE_TAG_PREDICTOR);
        tcu::LogValueInfo::write((LogValueInfo *)&workload,CVar14,__buf_04,(size_t)psVar10);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"Order",&local_65b);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_590,"Order of sample",&local_65c);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5b0,glcts::fixed_sample_locations_values + 1,&local_65d);
        psVar10 = &local_5b0;
        tcu::LogValueInfo::LogValueInfo
                  (&local_98,&local_570,&local_590,psVar10,QP_SAMPLE_VALUE_TAG_PREDICTOR);
        tcu::LogValueInfo::write(&local_98,CVar14,__buf_05,(size_t)psVar10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5d0,"TestTime",&local_65e);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_198,"Test render time",&local_65f);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"us",&local_660);
        psVar10 = &local_1b8;
        tcu::LogValueInfo::LogValueInfo
                  (&local_4a8,&local_5d0,&local_198,psVar10,QP_SAMPLE_VALUE_TAG_RESPONSE);
        tcu::LogValueInfo::write(&local_4a8,CVar14,__buf_06,(size_t)psVar10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d8,"NullTime",&local_661);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,"Read pixels time",&local_662);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"us",&local_663);
        psVar10 = &local_218;
        tcu::LogValueInfo::LogValueInfo
                  (&local_510,&local_1d8,&local_1f8,psVar10,QP_SAMPLE_VALUE_TAG_RESPONSE);
        tcu::LogValueInfo::write(&local_510,CVar14,__buf_07,(size_t)psVar10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_238,"BaseTime",&local_664);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_258,"Base render time",&local_665);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"us",&local_666);
        psVar10 = &local_278;
        tcu::LogValueInfo::LogValueInfo
                  (&local_100,&local_238,&local_258,psVar10,QP_SAMPLE_VALUE_TAG_RESPONSE);
        tcu::LogValueInfo::write(&local_100,CVar14,__buf_08,(size_t)psVar10);
        tcu::TestLog::endSampleInfo((TestLog *)TVar2);
        tcu::LogValueInfo::~LogValueInfo(&local_100);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_238);
        tcu::LogValueInfo::~LogValueInfo(&local_510);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_1d8);
        tcu::LogValueInfo::~LogValueInfo(&local_4a8);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_5d0);
        tcu::LogValueInfo::~LogValueInfo(&local_98);
        std::__cxx11::string::~string((string *)&local_5b0);
        std::__cxx11::string::~string((string *)&local_590);
        std::__cxx11::string::~string((string *)&local_570);
        tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&workload);
        std::__cxx11::string::~string((string *)&local_550);
        std::__cxx11::string::~string((string *)&local_530);
        std::__cxx11::string::~string((string *)&local_5f0);
        piVar20 = &this_01->workload;
        for (uVar21 = 0; uVar21 < uVar12; uVar21 = uVar21 + 1) {
          auStack_408._0_8_ = (pointer)0x0;
          auStack_408._8_8_ = (pointer)0x0;
          _uStack_3f8 = (pointer)0x0;
          _workload = TVar2;
          pSVar9 = tcu::SampleBuilder::operator<<((SampleBuilder *)&workload,*piVar20);
          pSVar9 = tcu::SampleBuilder::operator<<(pSVar9,piVar20[-1]);
          pSVar9 = tcu::SampleBuilder::operator<<(pSVar9,*(deInt64 *)(piVar20 + -3));
          pSVar9 = tcu::SampleBuilder::operator<<(pSVar9,((Sample *)(piVar20 + -7))->nullTime);
          pSVar9 = tcu::SampleBuilder::operator<<(pSVar9,*(deInt64 *)(piVar20 + -5));
          tcu::SampleBuilder::operator<<(pSVar9,(EndSampleToken *)&tcu::TestLog::EndSample);
          std::_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
          ~_Vector_base((_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>
                         *)auStack_408);
          piVar20 = piVar20 + 8;
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_510,"Workload",(allocator<char> *)&local_198);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"Workload",(allocator<char> *)&local_1b8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5f0,glcts::fixed_sample_locations_values + 1,
                   (allocator<char> *)&local_1d8);
        psVar10 = &local_5f0;
        tcu::LogValueInfo::LogValueInfo
                  ((LogValueInfo *)&workload,&local_510.m_name,&local_100.m_name,psVar10,
                   QP_SAMPLE_VALUE_TAG_PREDICTOR);
        tcu::LogValueInfo::write((LogValueInfo *)&workload,CVar14,__buf_09,(size_t)psVar10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_530,"Order",(allocator<char> *)&local_1f8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_550,"Order of sample",(allocator<char> *)&local_218);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_570,glcts::fixed_sample_locations_values + 1,
                   (allocator<char> *)&local_238);
        psVar10 = &local_570;
        tcu::LogValueInfo::LogValueInfo
                  (&local_98,&local_530,&local_550,psVar10,QP_SAMPLE_VALUE_TAG_PREDICTOR);
        tcu::LogValueInfo::write(&local_98,CVar14,__buf_10,(size_t)psVar10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_590,"TestTime",(allocator<char> *)&local_258);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5b0,"Test render time",(allocator<char> *)&local_278);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5d0,"us",(allocator<char> *)&stack0xfffffffffffff997);
        psVar10 = &local_5d0;
        tcu::LogValueInfo::LogValueInfo
                  (&local_4a8,&local_590,&local_5b0,psVar10,QP_SAMPLE_VALUE_TAG_RESPONSE);
        tcu::LogValueInfo::write(&local_4a8,CVar14,__buf_11,(size_t)psVar10);
        tcu::TestLog::endSampleInfo((TestLog *)TVar2);
        tcu::LogValueInfo::~LogValueInfo(&local_4a8);
        std::__cxx11::string::~string((string *)&local_5d0);
        std::__cxx11::string::~string((string *)&local_5b0);
        std::__cxx11::string::~string((string *)&local_590);
        tcu::LogValueInfo::~LogValueInfo(&local_98);
        std::__cxx11::string::~string((string *)&local_570);
        std::__cxx11::string::~string((string *)&local_550);
        std::__cxx11::string::~string((string *)&local_530);
        tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&workload);
        std::__cxx11::string::~string((string *)&local_5f0);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_510);
        piVar20 = &this_01->workload;
        for (uVar21 = 0; uVar21 < uVar12; uVar21 = uVar21 + 1) {
          auStack_408._0_8_ = (pointer)0x0;
          auStack_408._8_8_ = (pointer)0x0;
          _uStack_3f8 = (pointer)0x0;
          _workload = TVar2;
          pSVar9 = tcu::SampleBuilder::operator<<((SampleBuilder *)&workload,*piVar20);
          pSVar9 = tcu::SampleBuilder::operator<<(pSVar9,piVar20[-1]);
          pSVar9 = tcu::SampleBuilder::operator<<(pSVar9,*(deInt64 *)(piVar20 + -3));
          tcu::SampleBuilder::operator<<(pSVar9,(EndSampleToken *)&tcu::TestLog::EndSample);
          std::_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
          ~_Vector_base((_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>
                         *)auStack_408);
          piVar20 = piVar20 + 8;
        }
      }
      tcu::TestLog::endSampleList((TestLog *)TVar2);
      pBVar3 = local_658;
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_158);
      (*(pBVar3->super_TestCase).super_TestNode._vptr_TestNode[5])(pBVar3,&results);
      tcu::ResultCollector::setTestContextResult
                (&pBVar3->m_results,(pBVar3->super_TestCase).super_TestNode.m_testCtx);
      tcu::TextureLevel::~TextureLevel(&resultTex);
      de::details::
      UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
      ::reset(&occludedData.
               super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
             );
      de::details::
      UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
      ::reset(&occluderData.
               super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
             );
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&params.super__Vector_base<int,_std::allocator<int>_>);
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
      ::~vector(&results);
      glu::ObjectWrapper::~ObjectWrapper(&depthbuffer.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&renderbuffer.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&framebuffer.super_ObjectWrapper);
      return STOP;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"occludedData->m_program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pDepthTests.cpp"
               ,0x244);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

BaseCase::IterateResult BaseCase::iterate (void)
{
	typedef de::MovePtr<RenderData> RenderDataP;

	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();

	const glu::Framebuffer	framebuffer			(gl);
	const glu::Renderbuffer	renderbuffer		(gl);
	const glu::Renderbuffer	depthbuffer			(gl);

	vector<Sample>			results;
	vector<int>				params;
	RenderDataP				occluderData;
	RenderDataP				occludedData;
	tcu::TextureLevel		resultTex			(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), RENDER_SIZE, RENDER_SIZE);
	int						maxWorkload			= 0;
	de::Random				rng					(deInt32Hash(deStringHash(getName())) ^ m_testCtx.getCommandLine().getBaseSeed());

	logDescription();

	gl.bindRenderbuffer(GL_RENDERBUFFER, *renderbuffer);
	gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, RENDER_SIZE, RENDER_SIZE);
	gl.bindRenderbuffer(GL_RENDERBUFFER, *depthbuffer);
	gl.renderbufferStorage(GL_RENDERBUFFER, GL_DEPTH24_STENCIL8, RENDER_SIZE, RENDER_SIZE);

	gl.bindFramebuffer(GL_FRAMEBUFFER, *framebuffer);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *renderbuffer);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, *depthbuffer);
	gl.viewport(0, 0, RENDER_SIZE, RENDER_SIZE);
	gl.clearColor(0.125f, 0.25f, 0.5f, 1.0f);

	maxWorkload = calibrate();

	// Setup data
	occluderData = RenderDataP(new RenderData (genOccluderGeometry(), m_renderCtx, log));
	occludedData = RenderDataP(new RenderData (genOccludedGeometry(), m_renderCtx, log));

	TCU_CHECK(occluderData->m_program.isOk());
	TCU_CHECK(occludedData->m_program.isOk());

	// Force initialization of GPU resources
	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	gl.enable(GL_DEPTH_TEST);

	render(*occluderData);
	render(*occludedData);
	glu::readPixels(m_renderCtx, 0, 0, resultTex.getAccess());

	logGeometry(resultTex.getAccess(), occluderData->m_program, occludedData->m_program);

	params.reserve(ITERATION_STEPS*ITERATION_SAMPLES);

	// Setup parameters
	for (int step = 0; step < ITERATION_STEPS; step++)
	{
		const int workload = maxWorkload*step/ITERATION_STEPS;

		for (int count = 0; count < ITERATION_SAMPLES; count++)
			params.push_back(workload);
	}

	rng.shuffle(params.begin(), params.end());

	// Render samples
	for (size_t ndx = 0; ndx < params.size(); ndx++)
	{
		const int	workload	= params[ndx];
		Sample		sample		= renderSample(*occluderData, *occludedData, workload);

		sample.workload = workload;
		sample.order = int(ndx);

		results.push_back(sample);
	}

	logSamples(results, "Samples", "Samples");
	logAnalysis(results);

	m_results.setTestContextResult(m_testCtx);

	return STOP;
}